

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

bool computeDualObjectiveValue(HighsLp *lp,HighsSolution *solution,double *dual_objective_value)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  uint uVar13;
  ulong uVar14;
  double *pdVar15;
  ulong uVar16;
  long lVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  
  *dual_objective_value = 0.0;
  bVar3 = solution->dual_valid;
  if (bVar3 == true) {
    dVar22 = lp->offset_;
    *dual_objective_value = dVar22;
    iVar4 = lp->num_col_;
    uVar13 = lp->num_row_ + iVar4;
    pdVar5 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar19 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar15 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar9 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    uVar14 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar14 = uVar16;
    }
    for (; uVar14 != uVar16; uVar16 = uVar16 + 1) {
      lVar17 = uVar16 - (long)iVar4;
      pdVar10 = pdVar19;
      pdVar12 = pdVar9;
      pdVar18 = pdVar11;
      pdVar20 = pdVar15;
      if ((long)iVar4 <= (long)uVar16) {
        pdVar10 = pdVar5 + lVar17;
        pdVar18 = pdVar6 + lVar17;
        pdVar20 = pdVar7 + lVar17;
        pdVar12 = pdVar8 + lVar17;
      }
      dVar1 = *pdVar20;
      dVar2 = *pdVar12;
      if ((-INFINITY < dVar1) || (dVar23 = 1.0, dVar2 < INFINITY)) {
        uVar21 = -(ulong)(*pdVar10 < (dVar1 + dVar2) * 0.5);
        dVar23 = (double)(~uVar21 & (ulong)dVar2 | (ulong)dVar1 & uVar21);
      }
      dVar22 = dVar22 + dVar23 * *pdVar18;
      *dual_objective_value = dVar22;
      pdVar9 = pdVar9 + 1;
      pdVar15 = pdVar15 + 1;
      pdVar11 = pdVar11 + 1;
      pdVar19 = pdVar19 + 1;
    }
  }
  return bVar3;
}

Assistant:

bool computeDualObjectiveValue(const HighsLp& lp, const HighsSolution& solution,
                               double& dual_objective_value) {
  dual_objective_value = 0;
  if (!solution.dual_valid) return false;
  // #2184 Make sure that the solution corresponds to this LP
  assert(solution.col_value.size() == static_cast<size_t>(lp.num_col_));
  assert(solution.col_dual.size() == static_cast<size_t>(lp.num_col_));
  assert(solution.row_value.size() == static_cast<size_t>(lp.num_row_));
  assert(solution.row_dual.size() == static_cast<size_t>(lp.num_row_));

  dual_objective_value = lp.offset_;
  double bound = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal =
        is_col ? solution.col_value[iVar] : solution.row_value[iRow];
    const double dual =
        is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free
      bound = 1;
    } else {
      const double mid = (lower + upper) * 0.5;
      bound = primal < mid ? lower : upper;
    }
    dual_objective_value += bound * dual;
  }
  return true;
}